

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O2

void __thiscall gui::MenuBar::handleMouseLeft(MenuBar *this)

{
  if (this->menuIsOpen_ == false) {
    selectMenu(this,-1,false);
  }
  else {
    selectMenuItem(this,-1);
  }
  Widget::handleMouseLeft(&this->super_Widget);
  return;
}

Assistant:

void MenuBar::handleMouseLeft() {
    if (!menuIsOpen_) {
        selectMenu(-1, false);
    } else {
        selectMenuItem(-1);
    }
    baseClass::handleMouseLeft();
}